

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

void __thiscall kj::anon_unknown_36::WebSocketImpl::abort(WebSocketImpl *this)

{
  AsyncIoStream *pAVar1;
  WebSocketImpl *this_local;
  
  Maybe<kj::(anonymous_namespace)::WebSocketImpl::ControlMessage>::operator=
            (&this->queuedControlMessage);
  Maybe<kj::Promise<void>_>::operator=(&this->sendingControlMessage);
  this->disconnected = true;
  pAVar1 = Own<kj::AsyncIoStream,_std::nullptr_t>::operator->(&this->stream);
  (*(pAVar1->super_AsyncInputStream)._vptr_AsyncInputStream[7])();
  pAVar1 = Own<kj::AsyncIoStream,_std::nullptr_t>::operator->(&this->stream);
  (*(pAVar1->super_AsyncInputStream)._vptr_AsyncInputStream[6])();
  return;
}

Assistant:

void abort() override {
    queuedControlMessage = kj::none;
    sendingControlMessage = kj::none;
    disconnected = true;
    stream->abortRead();
    stream->shutdownWrite();
  }